

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

float dx(qnode_ptr_t p,qnode_ptr_t q,int x,int y,int z)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  kernel_t *pkVar4;
  int iVar5;
  float fVar6;
  
  iVar2 = C.m;
  iVar1 = C.m / 2;
  iVar5 = p->ofst + iVar1;
  if ((((y < iVar5) || (x < iVar5)) || (p->sizy - iVar5 <= x)) || (p->sizx - iVar5 <= y)) {
    (*q->param_ptr[z])[x * q->res + y].err = 1;
    fVar6 = 0.0;
  }
  else {
    iVar5 = p->res;
    (*q->param_ptr[z])[iVar5 * x + y].err = 0;
    fVar6 = 0.0;
    if (-2 < iVar2) {
      iVar2 = -iVar1;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      pfVar3 = *p->gauss_ptr[z] + ((long)x - (long)iVar1) * (long)iVar5 + (long)y;
      iVar2 = iVar1 + iVar2 + 1;
      pkVar4 = &C;
      do {
        fVar6 = fVar6 + *pfVar3 * pkVar4->k[0];
        pkVar4 = (kernel_t *)(pkVar4->k + 1);
        pfVar3 = pfVar3 + iVar5;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    fVar6 = fVar6 / C.f;
  }
  return fVar6;
}

Assistant:

float dx(p,q,x,y,z)
qnode_ptr_t p, q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,p->sizy,p->sizx,p->ofst,h,1)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[p->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*p->gauss_ptr[z])[p->res*(x+i) + y]*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}